

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O2

double __thiscall QpVector::norm2(QpVector *this)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)this->num_nz;
  if (this->num_nz < 1) {
    uVar2 = uVar3;
  }
  dVar4 = 0.0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar1 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3]];
    dVar4 = dVar4 + dVar1 * dVar1;
  }
  return dVar4;
}

Assistant:

double norm2() {
    double val = 0.0;

    for (HighsInt i = 0; i < num_nz; i++) {
      val += value[index[i]] * value[index[i]];
    }

    return val;
  }